

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void libtorrent::utp_stream::on_read
               (void *self,size_t bytes_transferred,error_code *ec,bool shutdown)

{
  byte *pbVar1;
  long lVar2;
  _Any_data local_58;
  long local_48;
  undefined8 local_40;
  size_t local_38;
  undefined8 local_30;
  error_category *peStack_28;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = *(undefined8 *)((long)self + 0x38);
  lVar2 = *(long *)((long)self + 0x30);
  if (lVar2 != 0) {
    local_58._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)
          &(((function<void_(const_boost::system::error_code_&,_unsigned_long)> *)
            ((long)self + 0x20))->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)self + 0x28);
    *(undefined8 *)((long)self + 0x30) = 0;
    *(undefined8 *)((long)self + 0x38) = 0;
    local_48 = lVar2;
  }
  local_30._0_4_ = ec->val_;
  local_30._4_1_ = ec->failed_;
  local_30._5_3_ = *(undefined3 *)&ec->field_0x5;
  peStack_28 = ec->cat_;
  local_38 = bytes_transferred;
  boost::asio::io_context::
  post<std::_Bind_result<void,std::function<void(boost::system::error_code_const&,unsigned_long)>(boost::system::error_code,unsigned_long)>>
            (*(io_context **)((long)self + 0x60),
             (_Bind_result<void,_std::function<void_(const_boost::system::error_code_&,_unsigned_long)>_(boost::system::error_code,_unsigned_long)>
              *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::function<void_(const_boost::system::error_code_&,_unsigned_long)>::operator=
            ((function<void_(const_boost::system::error_code_&,_unsigned_long)> *)
             ((long)self + 0x20),(nullptr_t)0x0);
  if ((shutdown) && (*(long *)((long)self + 0x68) != 0)) {
    pbVar1 = (byte *)(*(long *)((long)self + 0x68) + 0x21a);
    *pbVar1 = *pbVar1 & 0xbf;
    *(undefined8 *)((long)self + 0x68) = 0;
  }
  return;
}

Assistant:

void utp_stream::on_read(void* self, std::size_t const bytes_transferred
	, error_code const& ec, bool const shutdown)
{
	auto* s = static_cast<utp_stream*>(self);

	UTP_LOGV("%8p: calling read handler read:%d ec:%s shutdown:%d\n", static_cast<void*>(s->m_impl)
		, int(bytes_transferred), ec.message().c_str(), shutdown);

	TORRENT_ASSERT(s->m_read_handler);
	TORRENT_ASSERT(bytes_transferred > 0 || ec || s->m_impl->m_null_buffers);
	s->m_io_service.post(std::bind<void>(std::move(s->m_read_handler), ec, bytes_transferred));
	s->m_read_handler = nullptr;
	if (shutdown && s->m_impl)
	{
		TORRENT_ASSERT(ec);
		detach_utp_impl(s->m_impl);
		s->m_impl = nullptr;
	}
}